

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_stack_extend(void **start,void **top,void **end)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)*end - (long)*start;
  iVar2 = 0;
  if (lVar3 < 0x3fffffff) {
    pvVar1 = yaml_realloc(*start,lVar3 * 2);
    iVar2 = 0;
    if (pvVar1 != (void *)0x0) {
      *top = (void *)(((long)*top - (long)*start) + (long)pvVar1);
      *end = (void *)((long)pvVar1 + ((long)*end - (long)*start) * 2);
      *start = pvVar1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

YAML_DECLARE(int)
yaml_stack_extend(void **start, void **top, void **end)
{
    void *new_start;

    if ((char *)*end - (char *)*start >= INT_MAX / 2)
	return 0;

    new_start = yaml_realloc(*start, ((char *)*end - (char *)*start)*2);

    if (!new_start) return 0;

    *top = (char *)new_start + ((char *)*top - (char *)*start);
    *end = (char *)new_start + ((char *)*end - (char *)*start)*2;
    *start = new_start;

    return 1;
}